

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

int google::protobuf::GlobalReplaceSubstring(string *substring,string *replacement,string *s)

{
  LogMessage *other;
  long lVar1;
  long lVar2;
  int iVar3;
  string tmp;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (s == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x650);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: s != nullptr: ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  iVar3 = 0;
  if ((s->_M_string_length != 0) && (iVar3 = 0, substring->_M_string_length != 0)) {
    local_68._0_8_ = (long)&local_68 + 0x10;
    local_68.filename_ = (char *)0x0;
    local_68.line_._0_1_ = 0;
    iVar3 = 0;
    lVar1 = std::__cxx11::string::find((char *)s,(ulong)(substring->_M_dataplus)._M_p,0);
    if (lVar1 != -1) {
      lVar2 = 0;
      iVar3 = 0;
      do {
        std::__cxx11::string::append((string *)&local_68,(ulong)s,(long)(int)lVar2);
        std::__cxx11::string::replace
                  ((ulong)&local_68,(ulong)local_68.filename_,(char *)0x0,
                   (ulong)(replacement->_M_dataplus)._M_p);
        lVar2 = lVar1 + substring->_M_string_length;
        lVar1 = std::__cxx11::string::find
                          ((char *)s,(ulong)(substring->_M_dataplus)._M_p,(long)(int)lVar2);
        iVar3 = iVar3 + 1;
      } while (lVar1 != -1);
      std::__cxx11::string::append((string *)&local_68,(ulong)s,(long)(int)lVar2);
      std::__cxx11::string::swap((string *)s);
    }
    if ((void *)local_68._0_8_ != (void *)((long)&local_68 + 0x10U)) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  return iVar3;
}

Assistant:

int GlobalReplaceSubstring(const std::string &substring,
                           const std::string &replacement, std::string *s) {
  GOOGLE_CHECK(s != nullptr);
  if (s->empty() || substring.empty())
    return 0;
  std::string tmp;
  int num_replacements = 0;
  int pos = 0;
  for (StringPiece::size_type match_pos =
           s->find(substring.data(), pos, substring.length());
       match_pos != std::string::npos; pos = match_pos + substring.length(),
                              match_pos = s->find(substring.data(), pos,
                                                  substring.length())) {
    ++num_replacements;
    // Append the original content before the match.
    tmp.append(*s, pos, match_pos - pos);
    // Append the replacement for the match.
    tmp.append(replacement.begin(), replacement.end());
  }
  // Append the content after the last match. If no replacements were made, the
  // original string is left untouched.
  if (num_replacements > 0) {
    tmp.append(*s, pos, s->length() - pos);
    s->swap(tmp);
  }
  return num_replacements;
}